

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O3

leb_Node leb_BoundingNode(leb_Heap *leb,float x,float y)

{
  uint32_t uVar1;
  leb_Node node;
  leb_Node node_00;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float t;
  float fVar7;
  float local_34;
  
  uVar4 = 0;
  if ((x < 0.0) || (y < 0.0)) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    if (x + y <= 1.0) {
      node.depth = 0;
      node.id = leb->maxDepth;
      uVar5 = 1;
      uVar1 = leb__HeapRead((leb_Heap *)leb->buffer,node);
      uVar4 = 0;
      if (uVar1 != 1) {
        uVar5 = 1;
        uVar2 = 1;
        uVar6 = 0;
        local_34 = x;
        do {
          node_00.depth = 0;
          node_00.id = leb->maxDepth;
          uVar3 = (uint)uVar4;
          if (leb->maxDepth == uVar3) {
            uVar5 = (ulong)uVar2;
            break;
          }
          if (y <= local_34) {
            if (uVar2 != uVar3) {
              uVar5 = (ulong)(uVar2 * 2) | uVar6 + 0x100000000 | 1;
            }
            fVar7 = (1.0 - local_34) - y;
          }
          else {
            if (uVar2 != uVar3) {
              uVar5 = (ulong)(uVar2 * 2) | uVar6 + 0x100000000;
            }
            fVar7 = y - local_34;
            local_34 = 1.0 - local_34;
          }
          uVar4 = uVar5 >> 0x20;
          local_34 = local_34 - y;
          uVar6 = uVar5 & 0xffffffff00000000;
          uVar2 = (uint)uVar5;
          uVar1 = leb__HeapRead((leb_Heap *)leb->buffer,node_00);
          y = fVar7;
        } while (uVar1 != 1);
        uVar4 = uVar4 << 0x20;
        uVar5 = uVar5 & 0xffffffff;
      }
    }
  }
  return (leb_Node)(uVar4 | uVar5);
}

Assistant:

LEBDEF leb_Node leb_BoundingNode(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x + y <= 1.0f) {
        node = {1u, 0};

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}